

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O0

void __thiscall
PhyloTree::PhyloTree
          (PhyloTree *this,vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *edges,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *leaf2NumMap)

{
  bool bVar1;
  string *psVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_RSI;
  string *in_RDI;
  string *psVar3;
  reference rVar4;
  reference rVar5;
  size_t i;
  size_type plen;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> partition;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> new_bitset;
  PhyloTreeEdge *edge;
  iterator __end1;
  iterator __begin1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *__range1;
  size_t len;
  Bipartition *in_stack_fffffffffffffeb8;
  reference in_stack_fffffffffffffec0;
  block_type in_stack_fffffffffffffec8;
  block_type *in_stack_fffffffffffffed0;
  block_type in_stack_fffffffffffffed8;
  block_type *in_stack_fffffffffffffee0;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *__args;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *local_a8;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_98 [2];
  reference local_50;
  PhyloTreeEdge *local_48;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  local_40;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *local_38;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *local_30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *local_10;
  
  psVar2 = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string(in_RDI);
  psVar3 = in_RDI + 0x20;
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector
            ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)0x16b55c);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)psVar3,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)psVar2);
  psVar3 = psVar2 + 0x50;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x16b58c);
  local_30 = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(local_18);
  psVar2 = psVar2 + 0x20;
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size(local_10);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::reserve
            ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)psVar2,(size_type)psVar3);
  local_38 = local_10;
  local_40._M_current =
       (PhyloTreeEdge *)
       std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin
                 ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)in_stack_fffffffffffffeb8
                 );
  local_48 = (PhyloTreeEdge *)
             std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end
                       ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                        in_stack_fffffffffffffeb8);
  rVar4.m_mask = in_stack_fffffffffffffed8;
  rVar4.m_block = in_stack_fffffffffffffee0;
  rVar5.m_mask = in_stack_fffffffffffffec8;
  rVar5.m_block = in_stack_fffffffffffffed0;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                        *)in_stack_fffffffffffffec0,
                       (__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                        *)in_stack_fffffffffffffeb8);
    if (!bVar1) break;
    local_50 = __gnu_cxx::
               __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
               ::operator*(&local_40);
    __args = local_30;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x16b65a);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)rVar4.m_block,
               rVar4.m_mask,(unsigned_long)rVar5.m_block,(allocator<unsigned_long> *)rVar5.m_mask);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x16b684);
    Bipartition::getPartition(in_stack_fffffffffffffeb8);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::size(local_98);
    for (local_a8 = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
        local_a8 < local_30;
        local_a8 = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                   ((long)&(local_a8->m_bits).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start + 1)) {
      rVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                         rVar5.m_block,rVar5.m_mask);
      rVar5 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                         rVar5.m_block,rVar5.m_mask);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reference::operator=
                ((reference *)in_stack_fffffffffffffec0,(reference *)in_stack_fffffffffffffeb8);
    }
    in_stack_fffffffffffffec0 = local_50;
    std::
    make_shared<Bipartition,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>&>
              (__args);
    PhyloTreeEdge::setOriginalEdge
              (in_stack_fffffffffffffec0,(shared_ptr<Bipartition> *)in_stack_fffffffffffffeb8);
    std::shared_ptr<Bipartition>::~shared_ptr((shared_ptr<Bipartition> *)0x16b85c);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::push_back
              ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)rVar5.m_block,
               (value_type *)rVar5.m_mask);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffec0);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffec0);
    __gnu_cxx::
    __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
    ::operator++(&local_40);
  }
  return;
}

Assistant:

PhyloTree::PhyloTree(vector<PhyloTreeEdge> &edges, vector<string> &leaf2NumMap) : leaf2NumMap(leaf2NumMap) {
//    this->leaf2NumMap = leaf2NumMap;
    size_t len = leaf2NumMap.size();
    this->edges.reserve(edges.size());
    for (auto &edge : edges) {
        boost::dynamic_bitset<> new_bitset(len);
        auto partition = edge.getPartition();
        auto plen = partition.size();
        for (size_t i=0; i < len; ++i) {
            new_bitset[len - i - 1] = partition[plen - i - 1];
        }
        edge.setOriginalEdge(make_shared<Bipartition>(new_bitset));
        this->edges.push_back(edge);
    }
}